

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateSpaceFilter.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
rtb::Filter::StateSpaceFilter<double>::pass
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          StateSpaceFilter<double> *this,vector<double,_std::allocator<double>_> *values,double f0)

{
  bool bVar1;
  reference pdVar2;
  double local_68;
  double local_60;
  double val;
  const_iterator __end0;
  const_iterator __begin0;
  vector<double,_std::allocator<double>_> *__range2;
  double timeDelta;
  double time;
  double f0_local;
  vector<double,_std::allocator<double>_> *values_local;
  StateSpaceFilter<double> *this_local;
  vector<double,_std::allocator<double>_> *filteredValues;
  
  resetState(this);
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  timeDelta = 0.0;
  __end0 = std::vector<double,_std::allocator<double>_>::begin(values);
  val = (double)std::vector<double,_std::allocator<double>_>::end(values);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                                     *)&val), bVar1) {
    pdVar2 = __gnu_cxx::
             __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end0);
    local_60 = *pdVar2;
    local_68 = filter(this,local_60,timeDelta,f0);
    std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,&local_68);
    timeDelta = timeDelta + 0.001;
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> StateSpaceFilter<T>::pass(const std::vector<T>& values, double f0) {

            resetState();
            std::vector<T> filteredValues;
            double time(0.), timeDelta(0.001);
            for (auto val : values) {
                filteredValues.push_back(filter(val, time, f0));
                time += timeDelta;
            }
            return filteredValues;
        }